

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O3

TValue * cpparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  ushort *puVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  lua_State *plVar6;
  short sVar7;
  byte bVar8;
  MSize i;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  void *pvVar20;
  char *pcVar21;
  size_t sVar22;
  GCproto *pGVar23;
  GCtab *t;
  TValue *pTVar24;
  void *pvVar25;
  GCstr *pGVar26;
  byte bVar27;
  long lVar28;
  uint uVar29;
  uint32_t hbits;
  MSize size;
  undefined4 *puVar30;
  double *pdVar31;
  void *__dest;
  ErrMsg em;
  int iVar32;
  lua_State *plVar33;
  byte *pbVar34;
  LexState *ls;
  byte *pbVar35;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  bool bVar39;
  FuncScope local_320;
  TValue local_310;
  long local_308;
  FuncScope *local_2f8;
  uint8_t local_2d8;
  undefined8 local_2cc;
  undefined8 uStack_2c4;
  byte local_2b8;
  undefined1 local_2b7;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  *(lua_State **)((long)ud + 8) = L;
  *(undefined8 *)ud = 0;
  *(undefined4 *)((long)ud + 0x2c) = 0;
  *(undefined8 *)((long)ud + 0x30) = 0;
  *(undefined8 *)((long)ud + 0x24) = 0x12100000000;
  *(undefined8 *)((long)ud + 0x78) = 0;
  *(undefined8 *)((long)ud + 0x80) = 0;
  *(undefined8 *)((long)ud + 0x84) = 0;
  *(undefined8 *)((long)ud + 0x8c) = 0;
  *(undefined8 *)((long)ud + 0x58) = 0x100000001;
  pvVar20 = lj_mem_realloc(L,*(void **)((long)ud + 0x38),*(MSize *)((long)ud + 0x44),0x20);
  *(void **)((long)ud + 0x38) = pvVar20;
  *(undefined4 *)((long)ud + 0x44) = 0x20;
  piVar2 = (int *)((long)ud + 0x2c);
  iVar32 = *piVar2;
  *piVar2 = *piVar2 + -1;
  if (iVar32 == 0) {
    uVar9 = fillbuf((LexState *)ud);
  }
  else {
    pbVar34 = *(byte **)((long)ud + 0x30);
    *(byte **)((long)ud + 0x30) = pbVar34 + 1;
    uVar9 = (uint)*pbVar34;
  }
  *(uint *)((long)ud + 0x20) = uVar9;
  uVar17 = uVar9;
  if (uVar9 == 0xef) {
    uVar17 = *(uint *)((long)ud + 0x2c);
    bVar39 = true;
    if (((1 < uVar17) && (pcVar21 = *(char **)((long)ud + 0x30), *pcVar21 == -0x45)) &&
       (pcVar21[1] == -0x41)) {
      *(char **)((long)ud + 0x30) = pcVar21 + 2;
      *(uint *)((long)ud + 0x2c) = uVar17 - 3;
      if (uVar17 == 2) {
        uVar17 = fillbuf((LexState *)ud);
      }
      else {
        *(char **)((long)ud + 0x30) = pcVar21 + 3;
        uVar17 = (uint)(byte)pcVar21[2];
      }
      *(uint *)((long)ud + 0x20) = uVar17;
      goto LAB_0011002b;
    }
  }
  else {
LAB_0011002b:
    if (uVar17 == 0x23) {
      do {
        piVar2 = (int *)((long)ud + 0x2c);
        iVar32 = *piVar2;
        *piVar2 = *piVar2 + -1;
        if (iVar32 == 0) {
          uVar9 = fillbuf((LexState *)ud);
        }
        else {
          pbVar34 = *(byte **)((long)ud + 0x30);
          *(byte **)((long)ud + 0x30) = pbVar34 + 1;
          uVar9 = (uint)*pbVar34;
        }
        *(uint *)((long)ud + 0x20) = uVar9;
        if (uVar9 == 0xffffffff) {
          bVar39 = true;
          goto LAB_001100f8;
        }
      } while ((uVar9 != 10) && (uVar9 != 0xd));
      inclinenumber((LexState *)ud);
      bVar39 = true;
      uVar17 = *(uint *)((long)ud + 0x20);
    }
    else {
      bVar39 = uVar17 != 0x1b;
      if (uVar9 != 0xef) goto LAB_001100f8;
    }
    if (uVar17 == 0x1b) {
      pTVar24 = L->top;
      L->top = pTVar24 + 1;
      em = LJ_ERR_BCBAD;
      goto LAB_00110b86;
    }
  }
LAB_001100f8:
  if (*(char **)((long)ud + 0x70) != (char *)0x0) {
    iVar32 = 0x62;
    if (bVar39) {
      iVar32 = 0x74;
    }
    pcVar21 = strchr(*(char **)((long)ud + 0x70),iVar32);
    if (pcVar21 == (char *)0x0) {
      pTVar24 = L->top;
      L->top = pTVar24 + 1;
      em = LJ_ERR_XMODE;
LAB_00110b86:
      pGVar26 = lj_err_str(L,em);
      (pTVar24->u32).lo = (uint32_t)pGVar26;
      (pTVar24->field_2).it = 0xfffffffb;
      lj_err_throw(L,3);
    }
  }
  if (bVar39) {
    plVar6 = *(lua_State **)((long)ud + 8);
    pcVar21 = *(char **)((long)ud + 0x68);
    sVar22 = strlen(pcVar21);
    pGVar26 = lj_str_new(plVar6,pcVar21,sVar22);
    *(GCstr **)((long)ud + 0x60) = pGVar26;
    pTVar24 = plVar6->top;
    (pTVar24->u32).lo = (uint32_t)pGVar26;
    (pTVar24->field_2).it = 0xfffffffb;
    pTVar24 = plVar6->top;
    plVar6->top = pTVar24 + 1;
    if ((TValue *)(ulong)(plVar6->maxstack).ptr32 <= pTVar24 + 1) {
      lj_state_growstack(plVar6,1);
    }
    *(undefined4 *)((long)ud + 0x94) = 0;
    fs_init((LexState *)ud,(FuncState *)&local_310.field_2);
    local_2b7 = 0;
    local_2cc = 0;
    uStack_2c4 = 0;
    local_2b8 = local_2b8 | 2;
    local_320.nactvar = local_2d8;
    local_320.flags = '\0';
    local_320.vstart = *(MSize *)(local_308 + 0x84);
    local_320.prev = local_2f8;
    local_2f8 = &local_320;
    bcemit_INS((FuncState *)&local_310.field_2,0x58);
    lj_lex_next((LexState *)ud);
    parse_chunk((LexState *)ud);
    if (*(int *)((long)ud + 0x24) != 0x121) {
      err_token((LexState *)ud,0x121);
    }
    pGVar23 = fs_finish((LexState *)ud,*(BCLine *)((long)ud + 0x58));
    plVar6->top = plVar6->top + -1;
LAB_00110a40:
    uVar10 = (L->env).gcptr32;
    pvVar20 = lj_mem_newgco(L,(uint)pGVar23->sizeuv * 4 + 0x14);
    *(undefined2 *)((long)pvVar20 + 5) = 8;
    *(undefined1 *)((long)pvVar20 + 7) = 0;
    *(uint *)((long)pvVar20 + 0x10) = (uint)pGVar23 + 0x40;
    *(uint32_t *)((long)pvVar20 + 8) = uVar10;
    pGVar23->flags = (pGVar23->flags - ((byte)(pGVar23->flags + 0x20 >> 3) & 0xe0)) + ' ';
    bVar8 = pGVar23->sizeuv;
    if ((ulong)bVar8 != 0) {
      uVar37 = 0;
      do {
        pvVar25 = lj_mem_newgco(L,0x18);
        *(undefined2 *)((long)pvVar25 + 5) = 0x105;
        *(undefined4 *)((long)pvVar25 + 0xc) = 0xffffffff;
        *(int *)((long)pvVar25 + 0x10) = (int)pvVar25 + 8;
        *(uint *)((long)pvVar25 + 0x14) =
             (uint)*(ushort *)((ulong)(pGVar23->uv).ptr32 + uVar37 * 2) << 0x18 ^ (uint)pGVar23;
        *(int *)((long)pvVar20 + uVar37 * 4 + 0x14) = (int)pvVar25;
        uVar37 = uVar37 + 1;
      } while (bVar8 != uVar37);
    }
    *(byte *)((long)pvVar20 + 7) = bVar8;
    pTVar24 = L->top;
    L->top = pTVar24 + 1;
    (pTVar24->u32).lo = (uint32_t)pvVar20;
    (pTVar24->field_2).it = 0xfffffff7;
    return (TValue *)0x0;
  }
  plVar6 = *(lua_State **)((long)ud + 8);
  *(uint32_t *)((long)ud + 0x5c) = *(int *)&plVar6->top - (plVar6->stack).ptr32;
  *(undefined4 *)((long)ud + 0x40) = 0;
  uVar9 = *(uint *)((long)ud + 0x2c);
  if (uVar9 < 0xd) {
    bcread_fill((LexState *)ud,0xd,0);
    uVar9 = *(uint *)((long)ud + 0x2c);
  }
  *(uint *)((long)ud + 0x2c) = uVar9 - 1;
  pcVar21 = *(char **)((long)ud + 0x30);
  *(char **)((long)ud + 0x30) = pcVar21 + 1;
  if (*pcVar21 == 'L') {
    *(uint *)((long)ud + 0x2c) = uVar9 - 2;
    *(char **)((long)ud + 0x30) = pcVar21 + 2;
    if (pcVar21[1] == 'J') {
      *(uint *)((long)ud + 0x2c) = uVar9 - 3;
      *(char **)((long)ud + 0x30) = pcVar21 + 3;
      if (pcVar21[2] == '\x01') {
        uVar10 = bcread_uleb128((LexState *)ud);
        *(uint32_t *)((long)ud + 0x94) = uVar10;
        if (uVar10 < 8) {
          if ((3 < uVar10) &&
             (plVar33 = *(lua_State **)((long)ud + 8),
             *(int *)((ulong)(plVar33->glref).ptr32 + 0xfc) == 0)) {
            pTVar24 = plVar33->top;
            uVar9 = (plVar33->stack).ptr32;
            luaopen_ffi(plVar33);
            plVar33->top = (TValue *)
                           ((long)pTVar24 + ((ulong)(plVar33->stack).ptr32 - (ulong)uVar9));
          }
          if ((uVar10 & 2) == 0) {
            uVar10 = bcread_uleb128((LexState *)ud);
            uVar9 = *(uint *)((long)ud + 0x2c);
            if (uVar9 < uVar10) {
              bcread_fill((LexState *)ud,uVar10,1);
              uVar9 = *(uint *)((long)ud + 0x2c);
            }
            plVar33 = *(lua_State **)((long)ud + 8);
            pcVar21 = *(char **)((long)ud + 0x30);
            *(uint *)((long)ud + 0x2c) = uVar9 - uVar10;
            sVar22 = (size_t)uVar10;
            *(char **)((long)ud + 0x30) = pcVar21 + sVar22;
          }
          else {
            plVar33 = *(lua_State **)((long)ud + 8);
            pcVar21 = *(char **)((long)ud + 0x68);
            sVar22 = strlen(pcVar21);
          }
          pGVar26 = lj_str_new(plVar33,pcVar21,sVar22);
          *(GCstr **)((long)ud + 0x60) = pGVar26;
          while (uVar9 = *(uint *)((long)ud + 0x2c), uVar9 == 0) {
LAB_0011036e:
            bcread_fill((LexState *)ud,5,0);
LAB_0011037d:
            uVar10 = bcread_uleb128((LexState *)ud);
            uVar9 = *(uint *)((long)ud + 0x2c);
            if (uVar10 == 0) goto LAB_00110a15;
            if (uVar9 < uVar10) {
              bcread_fill((LexState *)ud,uVar10,1);
              uVar9 = *(uint *)((long)ud + 0x2c);
            }
            *(uint *)((long)ud + 0x2c) = uVar9 - 1;
            pbVar34 = *(byte **)((long)ud + 0x30);
            *(byte **)((long)ud + 0x30) = pbVar34 + 1;
            bVar8 = *pbVar34;
            *(uint *)((long)ud + 0x2c) = uVar9 - 2;
            *(byte **)((long)ud + 0x30) = pbVar34 + 2;
            bVar27 = pbVar34[1];
            *(uint *)((long)ud + 0x2c) = uVar9 - 3;
            *(byte **)((long)ud + 0x30) = pbVar34 + 3;
            bVar3 = pbVar34[2];
            *(uint *)((long)ud + 0x2c) = uVar9 - 4;
            *(byte **)((long)ud + 0x30) = pbVar34 + 4;
            bVar4 = pbVar34[3];
            uVar11 = bcread_uleb128((LexState *)ud);
            uVar12 = bcread_uleb128((LexState *)ud);
            uVar13 = bcread_uleb128((LexState *)ud);
            uVar16 = 0;
            if ((*(byte *)((long)ud + 0x94) & 2) == 0) {
              uVar14 = bcread_uleb128((LexState *)ud);
              uVar15 = 0;
              sVar22 = 0;
              uVar16 = 0;
              if (uVar14 != 0) {
                uVar15 = bcread_uleb128((LexState *)ud);
                uVar16 = bcread_uleb128((LexState *)ud);
                sVar22 = (size_t)uVar14;
              }
            }
            else {
              uVar15 = 0;
              sVar22 = 0;
            }
            uVar29 = uVar13 + 1;
            uVar36 = (uVar11 + uVar29) * 4 + 0x47 & 0xfffffff8;
            iVar38 = uVar36 + uVar12 * 8;
            uVar17 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + iVar38;
            iVar32 = (int)sVar22;
            size = iVar32 + uVar17;
            pvVar25 = lj_mem_newgco(*(lua_State **)((long)ud + 8),size);
            *(undefined1 *)((long)pvVar25 + 5) = 7;
            *(byte *)((long)pvVar25 + 6) = bVar27;
            *(byte *)((long)pvVar25 + 7) = bVar3;
            *(uint *)((long)pvVar25 + 8) = uVar29;
            lVar28 = (ulong)uVar36 + (long)pvVar25;
            *(int *)((long)pvVar25 + 0x10) = (int)lVar28;
            *(uint32_t *)((long)pvVar25 + 0x14) = iVar38 + (uint32_t)pvVar25;
            *(undefined4 *)((long)pvVar25 + 0x18) = 0;
            *(uint32_t *)((long)pvVar25 + 0x1c) = uVar12;
            *(MSize *)((long)pvVar25 + 0x20) = size;
            *(byte *)((long)pvVar25 + 0x24) = bVar4;
            *(byte *)((long)pvVar25 + 0x25) = bVar8;
            *(undefined2 *)((long)pvVar25 + 0x26) = 0;
            *(undefined4 *)((long)pvVar25 + 0x28) = *(undefined4 *)((long)ud + 0x60);
            *(undefined4 *)(lVar28 + (ulong)(uVar11 + 1) * -4) = 0;
            bVar8 = (bVar8 & 2) >> 1;
            *(uint *)((long)pvVar25 + 0x40) =
                 (uint)bVar8 + (uint)bVar8 * 2 + (uint)bVar3 * 0x100 + 0x55;
            uVar36 = uVar29 * 4 - 4;
            pvVar20 = *(void **)((long)ud + 0x30);
            *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar36;
            *(ulong *)((long)ud + 0x30) = (long)pvVar20 + (ulong)uVar36;
            memcpy((void *)((long)pvVar25 + 0x44),pvVar20,(ulong)uVar36);
            if ((1 < uVar29) && ((*(uint *)((long)ud + 0x94) & 1) != 0)) {
              lVar28 = 0;
              do {
                uVar36 = *(uint *)((long)pvVar25 + lVar28 * 4 + 0x44);
                *(uint *)((long)pvVar25 + lVar28 * 4 + 0x44) =
                     uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                     uVar36 << 0x18;
                lVar28 = lVar28 + 1;
              } while ((ulong)uVar29 - 1 != lVar28);
            }
            if (bVar4 != 0) {
              uVar36 = (uint)bVar4 + (uint)bVar4;
              uVar29 = *(uint *)((long)pvVar25 + 0x14);
              pvVar20 = *(void **)((long)ud + 0x30);
              *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar36;
              *(ulong *)((long)ud + 0x30) = (long)pvVar20 + (ulong)uVar36;
              memcpy((void *)(ulong)uVar29,pvVar20,(ulong)uVar36);
              if ((*(byte *)((long)ud + 0x94) & 1) != 0) {
                uVar37 = 0;
                do {
                  puVar1 = (ushort *)((long)(ulong)uVar29 + uVar37 * 2);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                  uVar37 = uVar37 + 1;
                } while (bVar4 != uVar37);
              }
            }
            if (uVar11 != 0) {
              puVar30 = (undefined4 *)((ulong)*(uint *)((long)pvVar25 + 0x10) + (ulong)uVar11 * -4);
              uVar14 = 0;
              do {
                uVar18 = bcread_uleb128((LexState *)ud);
                if (uVar18 < 5) {
                  if (uVar18 == 0) {
                    ls = *(LexState **)((long)ud + 8);
                    uVar37 = (ls->lookaheadval).u64;
                    if (uVar37 <= (long)*(int *)((long)ud + 0x5c) + (ulong)(uint)ls->token)
                    goto LAB_00110b4f;
                    (ls->lookaheadval).u64 = uVar37 - 8;
                    *puVar30 = *(undefined4 *)(uVar37 - 8);
                  }
                  else if (uVar18 == 1) {
                    uVar19 = bcread_uleb128((LexState *)ud);
                    uVar18 = bcread_uleb128((LexState *)ud);
                    if (uVar18 == 0) {
                      hbits = 0;
                    }
                    else {
                      hbits = 1;
                      if (uVar18 != 1) {
                        uVar29 = 0x1f;
                        if (uVar18 - 1 != 0) {
                          for (; uVar18 - 1 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                          }
                        }
                        hbits = (uVar29 ^ 0xffffffe0) + 0x21;
                      }
                    }
                    t = lj_tab_new(*(lua_State **)((long)ud + 8),uVar19,hbits);
                    if (uVar19 != 0) {
                      pTVar24 = (TValue *)(ulong)(t->array).ptr32;
                      do {
                        bcread_ktabk((LexState *)ud,pTVar24);
                        pTVar24 = pTVar24 + 1;
                        uVar19 = uVar19 - 1;
                      } while (uVar19 != 0);
                    }
                    for (; uVar18 != 0; uVar18 = uVar18 - 1) {
                      bcread_ktabk((LexState *)ud,&local_310);
                      pTVar24 = lj_tab_set(*(lua_State **)((long)ud + 8),t,&local_310);
                      bcread_ktabk((LexState *)ud,pTVar24);
                    }
                    *puVar30 = (int)t;
                  }
                  else {
                    sVar7 = (uVar18 != 2) + 0xb;
                    if (uVar18 == 4) {
                      sVar7 = 0x10;
                    }
                    pvVar20 = lj_mem_newgco(*(lua_State **)((long)ud + 8),
                                            (uint)(uVar18 == 4) * 8 + 0x10);
                    *(undefined1 *)((long)pvVar20 + 5) = 10;
                    *(short *)((long)pvVar20 + 6) = sVar7;
                    *puVar30 = (int)pvVar20;
                    uVar19 = bcread_uleb128((LexState *)ud);
                    *(uint32_t *)((long)pvVar20 + 8) = uVar19;
                    uVar19 = bcread_uleb128((LexState *)ud);
                    *(uint32_t *)((long)pvVar20 + 0xc) = uVar19;
                    if (uVar18 == 4) {
                      uVar18 = bcread_uleb128((LexState *)ud);
                      *(uint32_t *)((long)pvVar20 + 0x10) = uVar18;
                      uVar18 = bcread_uleb128((LexState *)ud);
                      *(uint32_t *)((long)pvVar20 + 0x14) = uVar18;
                    }
                  }
                }
                else {
                  uVar29 = uVar18 - 5;
                  pcVar21 = *(char **)((long)ud + 0x30);
                  *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar29;
                  *(char **)((long)ud + 0x30) = pcVar21 + uVar29;
                  pGVar26 = lj_str_new(*(lua_State **)((long)ud + 8),pcVar21,(ulong)uVar29);
                  *puVar30 = (int)pGVar26;
                }
                uVar14 = uVar14 + 1;
                puVar30 = puVar30 + 1;
              } while (uVar14 != uVar11);
            }
            *(uint32_t *)((long)pvVar25 + 0x18) = uVar11;
            if (uVar12 != 0) {
              pdVar31 = (double *)(ulong)*(uint *)((long)pvVar25 + 0x10);
              uVar11 = 0;
              do {
                bVar8 = **(byte **)((long)ud + 0x30);
                pbVar34 = *(byte **)((long)ud + 0x30) + 1;
                uVar29 = (uint)(bVar8 >> 1);
                if ((char)bVar8 < '\0') {
                  uVar29 = uVar29 & 0x3f;
                  iVar38 = *(int *)((long)ud + 0x2c);
                  bVar27 = 6;
                  pbVar35 = pbVar34;
                  do {
                    uVar29 = uVar29 | (*pbVar35 & 0x7f) << (bVar27 & 0x1f);
                    iVar38 = iVar38 + -1;
                    *(int *)((long)ud + 0x2c) = iVar38;
                    pbVar34 = pbVar35 + 1;
                    bVar27 = bVar27 + 7;
                    bVar3 = *pbVar35;
                    pbVar35 = pbVar34;
                  } while ((char)bVar3 < '\0');
                }
                else {
                  iVar38 = *(int *)((long)ud + 0x2c);
                }
                *(int *)((long)ud + 0x2c) = iVar38 + -1;
                *(byte **)((long)ud + 0x30) = pbVar34;
                if ((bVar8 & 1) == 0) {
                  *pdVar31 = (double)(int)uVar29;
                }
                else {
                  *(uint *)pdVar31 = uVar29;
                  uVar14 = bcread_uleb128((LexState *)ud);
                  *(uint32_t *)((long)pdVar31 + 4) = uVar14;
                }
                uVar11 = uVar11 + 1;
                pdVar31 = pdVar31 + 1;
              } while (uVar11 != uVar12);
            }
            *(uint32_t *)((long)pvVar25 + 0x2c) = uVar15;
            *(uint32_t *)((long)pvVar25 + 0x30) = uVar16;
            if (iVar32 == 0) {
              *(undefined8 *)((long)pvVar25 + 0x34) = 0;
              uVar17 = 0;
            }
            else {
              bVar8 = 2 - ((int)uVar16 < 0x10000);
              if ((int)uVar16 < 0x100) {
                bVar8 = 0;
              }
              uVar37 = (long)pvVar25 + (ulong)uVar17;
              iVar38 = (int)uVar37;
              *(int *)((long)pvVar25 + 0x34) = iVar38;
              *(uint32_t *)((long)pvVar25 + 0x38) = (uVar13 << (bVar8 & 0x1f)) + iVar38;
              pvVar20 = *(void **)((long)ud + 0x30);
              *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - iVar32;
              __dest = (void *)(uVar37 & 0xffffffff);
              *(size_t *)((long)ud + 0x30) = (long)pvVar20 + sVar22;
              memcpy(__dest,pvVar20,sVar22);
              if (((*(byte *)((long)ud + 0x94) & 1) != 0) &&
                 (0xff < (int)*(uint *)((long)pvVar25 + 0x30))) {
                uVar17 = *(int *)((long)pvVar25 + 8) - 1;
                if (*(uint *)((long)pvVar25 + 0x30) < 0x10000) {
                  if (uVar17 != 0) {
                    uVar37 = 0;
                    do {
                      puVar1 = (ushort *)((long)__dest + uVar37 * 2);
                      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                      uVar37 = uVar37 + 1;
                    } while (uVar17 != uVar37);
                  }
                }
                else if (uVar17 != 0) {
                  uVar37 = 0;
                  do {
                    uVar29 = *(uint *)((long)__dest + uVar37 * 4);
                    *(uint *)((long)__dest + uVar37 * 4) =
                         uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                         uVar29 << 0x18;
                    uVar37 = uVar37 + 1;
                  } while (uVar17 != uVar37);
                }
              }
              uVar29 = (uint)*(byte *)((long)pvVar25 + 0x24);
              uVar17 = *(uint *)((long)pvVar25 + 0x38);
              pcVar21 = (char *)(ulong)uVar17;
              if (*(byte *)((long)pvVar25 + 0x24) != 0) {
                do {
                  uVar37 = (ulong)pcVar21 & 0xffffffff;
                  do {
                    uVar17 = (int)uVar37 + 1;
                    uVar37 = (ulong)uVar17;
                    cVar5 = *pcVar21;
                    pcVar21 = pcVar21 + 1;
                  } while (cVar5 != '\0');
                  uVar29 = uVar29 - 1;
                } while (uVar29 != 0);
              }
            }
            *(uint *)((long)pvVar25 + 0x3c) = uVar17;
            if (uVar10 != uVar9 - *(int *)((long)ud + 0x2c)) goto LAB_00110b4a;
            pTVar24 = plVar6->top;
            (pTVar24->u32).lo = (uint32_t)pvVar25;
            (pTVar24->field_2).it = 0xfffffff8;
            pTVar24 = plVar6->top;
            plVar6->top = pTVar24 + 1;
            if ((TValue *)(ulong)(plVar6->maxstack).ptr32 <= pTVar24 + 1) {
              lj_state_growstack(plVar6,1);
            }
          }
          if (**(char **)((long)ud + 0x30) != '\0') {
            if (uVar9 < 5) goto LAB_0011036e;
            goto LAB_0011037d;
          }
          uVar9 = uVar9 - 1;
          *(uint *)((long)ud + 0x2c) = uVar9;
          *(char **)((long)ud + 0x30) = *(char **)((long)ud + 0x30) + 1;
LAB_00110a15:
          if ((0 < (int)uVar9) ||
             (pTVar24 = plVar6->top + -1,
             pTVar24 != (TValue *)((long)*(int *)((long)ud + 0x5c) + (ulong)(plVar6->stack).ptr32)))
          {
LAB_00110b4a:
            ls = *(LexState **)((long)ud + 8);
LAB_00110b4f:
            bcread_error(ls,(ErrMsg)*(undefined8 *)((long)ud + 0x68));
          }
          plVar6->top = pTVar24;
          pGVar23 = (GCproto *)(ulong)(pTVar24->u32).lo;
          goto LAB_00110a40;
        }
      }
    }
  }
  bcread_error(*(LexState **)((long)ud + 8),(ErrMsg)*(undefined8 *)((long)ud + 0x68));
}

Assistant:

static TValue *cpparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  LexState *ls = (LexState *)ud;
  GCproto *pt;
  GCfunc *fn;
  int bc;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  bc = lj_lex_setup(L, ls);
  if (ls->mode && !strchr(ls->mode, bc ? 'b' : 't')) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_XMODE));
    lj_err_throw(L, LUA_ERRSYNTAX);
  }
  pt = bc ? lj_bcread(ls) : lj_parse(ls);
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* Don't combine above/below into one statement. */
  setfuncV(L, L->top++, fn);
  return NULL;
}